

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
waitGLResults(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
              *this)

{
  RenderContext *context;
  Surface dummySurface;
  PixelBufferAccess local_38;
  
  tcu::Surface::Surface(&dummySurface,0x20,0x20);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess(&local_38,&dummySurface);
  glu::readPixels(context,0,0,&local_38);
  tcu::Surface::~Surface(&dummySurface);
  return;
}

Assistant:

void BasicBufferCase<SampleType>::waitGLResults (void)
{
	tcu::Surface dummySurface(DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
	glu::readPixels(m_context.getRenderContext(), 0, 0, dummySurface.getAccess());
}